

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabBar(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  float fVar5;
  bool tab_bar_appearing;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *in_stack_00000100;
  ImGuiTabBar *local_28;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 uVar6;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    pIVar2 = GImGui->CurrentTabBar;
    if (pIVar2 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Mismatched BeginTabBar()/EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x19fc,"void ImGui::EndTabBar()");
    }
    if ((pIVar2->WantLayout & 1U) != 0) {
      TabBarLayout(in_stack_00000100);
    }
    uVar6 = pIVar2->PrevFrameVisible + 1 < pIVar3->FrameCount;
    if ((((pIVar2->VisibleTabWasSubmitted & 1U) != 0) || (pIVar2->VisibleTabId == 0)) ||
       ((bool)uVar6)) {
      fVar5 = ImMax<float>((pIVar1->DC).CursorPos.y - (pIVar2->BarRect).Max.y,0.0);
      pIVar2->LastTabContentHeight = fVar5;
    }
    else {
      (pIVar1->DC).CursorPos.y = (pIVar2->BarRect).Max.y + pIVar2->LastTabContentHeight;
    }
    if ((pIVar2->Flags & 0x100000U) == 0) {
      PopID();
    }
    ImVector<ImGuiPtrOrIndex>::pop_back
              ((ImVector<ImGuiPtrOrIndex> *)
               CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
    bVar4 = ImVector<ImGuiPtrOrIndex>::empty(&pIVar3->CurrentTabBarStack);
    if (bVar4) {
      local_28 = (ImGuiTabBar *)0x0;
    }
    else {
      ImVector<ImGuiPtrOrIndex>::back
                ((ImVector<ImGuiPtrOrIndex> *)
                 CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
      local_28 = GetTabBarFromTabBarRef
                           ((ImGuiPtrOrIndex *)
                            CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffe6,
                                                    in_stack_ffffffffffffffe0)));
    }
    pIVar3->CurrentTabBar = local_28;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
        tab_bar->LastTabContentHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, 0.0f);
    else
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->LastTabContentHeight;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}